

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnsignedDISInteger.h
# Opt level: O0

void __thiscall
DIS::UnsignedDISInteger::UnsignedDISInteger(UnsignedDISInteger *this,UnsignedDISInteger *param_1)

{
  UnsignedDISInteger *param_1_local;
  UnsignedDISInteger *this_local;
  
  this->_vptr_UnsignedDISInteger = (_func_int **)&PTR__UnsignedDISInteger_002695e0;
  this->_val = param_1->_val;
  return;
}

Assistant:

class OPENDIS7_EXPORT UnsignedDISInteger
{
protected:
  /** unsigned integer */
  unsigned int _val; 


 public:
    UnsignedDISInteger();
    virtual ~UnsignedDISInteger();

    virtual void marshal(DataStream& dataStream) const;
    virtual void unmarshal(DataStream& dataStream);

    unsigned int getVal() const; 
    void setVal(unsigned int pX); 


virtual int getMarshalledSize() const;

     bool operator  ==(const UnsignedDISInteger& rhs) const;
}